

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O2

int32 Js::JavascriptConversion::ToInt32_Full(Var aValue,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  double T1;
  bool bVar3;
  int32 iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptBoolean *pJVar8;
  JavascriptTypedNumber<long> *pJVar9;
  JavascriptString *this;
  JavascriptTypedNumber<unsigned_long> *pJVar10;
  uint uVar11;
  ScriptContext *checkScriptContext;
  double local_40;
  RecyclableObject *local_38;
  
  bVar3 = JavascriptStackWalker::ValidateTopJitFrame(scriptContext);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x3ca,
                                "(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext))",
                                "Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext)");
    if (!bVar3) goto LAB_009857b5;
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(aValue);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x3cb,"(!TaggedInt::Is(aValue))","Should be detected");
    if (!bVar3) goto LAB_009857b5;
    *puVar6 = 0;
  }
  bVar3 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar3) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    checkScriptContext =
         (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
         scriptContext.ptr;
  }
  else {
    checkScriptContext = (ScriptContext *)0x0;
  }
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_009857b5;
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(aValue);
  if (bVar3) {
switchD_009854df_caseD_3:
    iVar4 = TaggedInt::ToInt32(aValue);
    return iVar4;
  }
  if ((ulong)aValue >> 0x32 == 0) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_009857b5;
      *puVar6 = 0;
    }
    TVar1 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar7), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_009857b5;
      *puVar6 = 0;
    }
    uVar11 = 0;
    switch(TVar1) {
    case TypeIds_Undefined:
    case TypeIds_Null:
      goto switchD_009854df_caseD_0;
    case TypeIds_Boolean:
switchD_009854df_caseD_2:
      pJVar8 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
      uVar11 = (uint)(pJVar8->value != 0);
switchD_009854df_caseD_0:
      return uVar11;
    case TypeIds_FirstNumberType:
      goto switchD_009854df_caseD_3;
    case TypeIds_Number:
      break;
    case TypeIds_Int64Number:
switchD_009854df_caseD_5:
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
      T1 = (double)pJVar9->m_value;
      goto LAB_009853e6;
    case TypeIds_LastNumberType:
switchD_009854df_caseD_6:
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
      T1 = ((double)CONCAT44(0x43300000,(int)pJVar10->m_value) - 4503599627370496.0) +
           ((double)CONCAT44(0x45300000,(int)(pJVar10->m_value >> 0x20)) - 1.9342813113834067e+25);
      goto LAB_009853e6;
    case TypeIds_String:
switchD_009854df_caseD_7:
      this = UnsafeVarTo<Js::JavascriptString>(aValue);
      bVar3 = JavascriptString::ToDouble(this,&local_40);
      if (!bVar3) {
        return 0;
      }
      iVar4 = JavascriptMath::ToInt32Core(local_40);
      return iVar4;
    case TypeIds_Symbol:
switchD_009854df_caseD_8:
      JavascriptError::TryThrowTypeError(checkScriptContext,scriptContext,-0x7ff5ec77,(PCWSTR)0x0);
      return 0;
    default:
      BVar5 = JavascriptOperators::IsObject(aValue);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                    ,0x3fd,"(JavascriptOperators::IsObject(aValue))",
                                    "bad type object in conversion ToInteger32");
        if (!bVar3) goto LAB_009857b5;
        *puVar6 = 0;
      }
      aValue = ToPrimitive<(Js::JavascriptHint)2>(aValue,scriptContext);
      if (aValue == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_009857b5;
        *puVar6 = 0;
      }
      bVar3 = TaggedInt::Is(aValue);
      if (bVar3) goto switchD_009854df_caseD_3;
      if (aValue < (Var)0x4000000000000) {
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
        if (pRVar7 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          local_38 = pRVar7;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_009857b5;
          *puVar6 = 0;
          pRVar7 = local_38;
        }
        TVar1 = ((pRVar7->type).ptr)->typeId;
        if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(pRVar7), BVar5 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          local_38 = (RecyclableObject *)__tls_get_addr(&PTR_013e5f18);
          *(undefined4 *)
           &(local_38->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) goto LAB_009857b5;
          *(undefined4 *)
           &(local_38->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 0;
        }
        switch(TVar1) {
        case TypeIds_Undefined:
        case TypeIds_Null:
          goto switchD_009854df_caseD_0;
        case TypeIds_Boolean:
          goto switchD_009854df_caseD_2;
        case TypeIds_FirstNumberType:
          goto switchD_009854df_caseD_3;
        case TypeIds_Number:
          break;
        case TypeIds_Int64Number:
          goto switchD_009854df_caseD_5;
        case TypeIds_LastNumberType:
          goto switchD_009854df_caseD_6;
        case TypeIds_String:
          goto switchD_009854df_caseD_7;
        case TypeIds_Symbol:
          goto switchD_009854df_caseD_8;
        default:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                      ,0x429,"(0)",
                                      "wrong call in ToInteger32_Full, no dynamic objects should get here."
                                     );
          if (bVar3) {
            *puVar6 = 0;
            JavascriptError::ThrowError(scriptContext,-0x7ff5fe4a,(PCWSTR)0x0);
          }
LAB_009857b5:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
      }
    }
  }
  T1 = JavascriptNumber::GetValue(aValue);
LAB_009853e6:
  iVar4 = JavascriptMath::ToInt32Core(T1);
  return iVar4;
}

Assistant:

int32 JavascriptConversion::ToInt32_Full(Var aValue, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Conv_ToInt32_Full);
        Assert(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext));
        AssertMsg(!TaggedInt::Is(aValue), "Should be detected");

        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        // This is used when TaggedInt's overflow but remain under int32
        // so Number is our most critical case:

        TypeId typeId = JavascriptOperators::GetTypeId(aValue);

        if (typeId == TypeIds_Number)
        {
            return JavascriptMath::ToInt32Core(JavascriptNumber::GetValue(aValue));
        }

        switch (typeId)
        {
        case TypeIds_Symbol:
            JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
            // Fallthrough to return 0 if exceptions are disabled
        case TypeIds_Undefined:
        case TypeIds_Null:
            return  0;

        case TypeIds_Integer:
            return TaggedInt::ToInt32(aValue);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

        case TypeIds_Int64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue());

        case TypeIds_UInt64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue());

        case TypeIds_String:
        {
            double result;
            if (UnsafeVarTo<JavascriptString>(aValue)->ToDouble(&result))
            {
                return JavascriptMath::ToInt32Core(result);
            }
            // If the string isn't a valid number, ToDouble returns NaN, and ToInt32 of that is 0
            return 0;
        }

        default:
            AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger32");
            aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
        }

        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Symbol:
            JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
            // Fallthrough to return 0 if exceptions are disabled
        case TypeIds_Undefined:
        case TypeIds_Null:
            return  0;

        case TypeIds_Integer:
            return TaggedInt::ToInt32(aValue);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

        case TypeIds_Number:
            return ToInt32(JavascriptNumber::GetValue(aValue));

        case TypeIds_Int64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue());

        case TypeIds_UInt64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue());

        case TypeIds_String:
        {
            double result;
            if (UnsafeVarTo<JavascriptString>(aValue)->ToDouble(&result))
            {
                return ToInt32(result);
            }
            // If the string isn't a valid number, ToDouble returns NaN, and ToInt32 of that is 0
            return 0;
        }

        default:
            AssertMsg(FALSE, "wrong call in ToInteger32_Full, no dynamic objects should get here.");
            JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
        }
        JIT_HELPER_END(Conv_ToInt32_Full);
    }